

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O2

void __thiscall S2NoAllocation::test_method(S2NoAllocation *this)

{
  Index rows;
  Index IVar1;
  Index IVar2;
  DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_3b0 [24];
  void *local_398;
  VectorXd x;
  Index c;
  VectorXd vx;
  VectorXd z;
  MatrixXd H0;
  VectorXd y;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> local_328 [24];
  void *local_310;
  MatrixXd H2;
  MatrixXd H1;
  MatrixXd J1;
  MatrixXd J0;
  RandomReturnType local_2a0;
  void *local_288;
  void *local_278;
  S2 Space;
  MatrixXd J2;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_d8 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_c0 [24];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_a8 [40];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_80 [40];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_58 [40];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_30 [40];
  
  mnf::S2::S2(&Space);
  c = 3;
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x,local_3b0);
  mnf::Point::~Point((Point *)&local_2a0);
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,local_3b0);
  mnf::Point::~Point((Point *)&local_2a0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::S2::randVec((Ref_conflict *)local_3b0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&vx,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_3b0);
  free(local_288);
  local_2a0.m_rows.m_value = mnf::Manifold::representationDim();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&z,(long *)&local_2a0);
  rows = c;
  IVar1 = mnf::Manifold::representationDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_2a0,rows,IVar1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&J0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2a0);
  local_2a0.m_rows.m_value = mnf::Manifold::representationDim();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&J1,&c,(long *)&local_2a0);
  local_2a0.m_rows.m_value = mnf::Manifold::representationDim();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&J2,&c,(long *)&local_2a0);
  IVar1 = mnf::Manifold::tangentDim();
  IVar2 = mnf::Manifold::tangentDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_2a0,IVar1,IVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2a0);
  IVar1 = mnf::Manifold::tangentDim();
  IVar2 = mnf::Manifold::tangentDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_2a0,IVar1,IVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2a0);
  IVar1 = mnf::Manifold::tangentDim();
  IVar2 = mnf::Manifold::tangentDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(&local_2a0,IVar1,IVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2a0);
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 0;
  mnf::utils::set_is_malloc_allowed(false);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_c0,&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0)
  ;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_3b0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vx,(type *)0x0);
  mnf::Manifold::retractation(&Space,local_c0,&local_2a0,local_3b0);
  free(local_398);
  free(local_288);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_d8,&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0)
  ;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_3b0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y,(type *)0x0);
  mnf::Manifold::pseudoLog(&Space,local_d8,&local_2a0,local_3b0);
  free(local_398);
  free(local_288);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_30,&J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&J0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_3b0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::applyDiffRetractation(&Space,local_30,&local_2a0,local_3b0);
  free(local_398);
  free(local_278);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_58,&H1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&H0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_3b0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_328,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vx,(type *)0x0);
  mnf::Manifold::applyTransport(&Space,local_58,&local_2a0,local_3b0,local_328);
  free(local_310);
  free(local_398);
  free(local_278);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_80,&H2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&H0,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_3b0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_328,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vx,(type *)0x0);
  mnf::Manifold::applyInvTransport(&Space,local_80,&local_2a0,local_3b0,local_328);
  free(local_310);
  free(local_398);
  free(local_278);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_a8,&H0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(type *)0x0);
  mnf::Manifold::getIdentityOnTxM(&Space,local_a8,&local_2a0);
  free(local_288);
  mnf::utils::set_is_malloc_allowed(true);
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 1;
  free(H2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(H1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(H0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(J2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(J1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(J0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(vx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  mnf::Manifold::~Manifold((Manifold *)&Space);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(S2NoAllocation)
{
  // We only test here that the operations on the manifold do not create
  // temporary. Passing arguments that are not recognize by the Eigen::Ref will
  // create temporaries, but this is the user's fault.
  S2 Space;
  Index c = 3;
  // VectorXd x = VectorXd::Random(Space.representationDim());
  // VectorXd y = VectorXd::Random(Space.representationDim());
  VectorXd x = Space.createRandomPoint().value();
  VectorXd y = Space.createRandomPoint().value();
  VectorXd vx = Space.randVec(x);
  VectorXd z(Space.representationDim());
  MatrixXd J0 = MatrixXd::Random(c, Space.representationDim());
  MatrixXd J1(c, Space.representationDim());
  MatrixXd J2(c, Space.representationDim());
  MatrixXd H0 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());
  MatrixXd H1 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());
  MatrixXd H2 = MatrixXd::Random(Space.tangentDim(), Space.tangentDim());

  internal::set_is_malloc_allowed(false);
  utils::set_is_malloc_allowed(false);
  {
    Space.retractation(z, x, vx);
    Space.pseudoLog(z, x, y);
    Space.applyDiffRetractation(J1, J0, x);
    Space.applyTransport(H1, H0, x, vx);
    Space.applyInvTransport(H2, H0, x, vx);
    Space.getIdentityOnTxM(H0, x);
  }
  utils::set_is_malloc_allowed(true);
  internal::set_is_malloc_allowed(true);
}